

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamReadGroupDictionary.cpp
# Opt level: O2

void __thiscall
BamTools::SamReadGroupDictionary::Add
          (SamReadGroupDictionary *this,SamReadGroupDictionary *readGroups)

{
  pointer pSVar1;
  pointer readGroup;
  
  pSVar1 = (readGroups->m_data).
           super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (readGroup = (readGroups->m_data).
                   super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start; readGroup != pSVar1;
      readGroup = readGroup + 1) {
    Add(this,readGroup);
  }
  return;
}

Assistant:

void SamReadGroupDictionary::Add(const SamReadGroupDictionary& readGroups)
{
    SamReadGroupConstIterator rgIter = readGroups.ConstBegin();
    SamReadGroupConstIterator rgEnd = readGroups.ConstEnd();
    for (; rgIter != rgEnd; ++rgIter)
        Add(*rgIter);
}